

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CategoricalMapping::clear_MappingType(CategoricalMapping *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  StringToInt64Map *this_00;
  
  if (this->_oneof_case_[0] == 2) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 != (undefined8 *)0x0) goto LAB_0031d81d;
    this_00 = (StringToInt64Map *)(this->MappingType_).int64tostringmap_;
    if (this_00 != (StringToInt64Map *)0x0) {
      Int64ToStringMap::~Int64ToStringMap((Int64ToStringMap *)this_00);
    }
  }
  else {
    if (this->_oneof_case_[0] != 1) goto LAB_0031d81d;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 != (undefined8 *)0x0) goto LAB_0031d81d;
    this_00 = (this->MappingType_).stringtoint64map_;
    if (this_00 != (StringToInt64Map *)0x0) {
      StringToInt64Map::~StringToInt64Map(this_00);
    }
  }
  operator_delete(this_00,0x48);
LAB_0031d81d:
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void CategoricalMapping::clear_MappingType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.CategoricalMapping)
  switch (MappingType_case()) {
    case kStringToInt64Map: {
      if (GetArenaForAllocation() == nullptr) {
        delete MappingType_.stringtoint64map_;
      }
      break;
    }
    case kInt64ToStringMap: {
      if (GetArenaForAllocation() == nullptr) {
        delete MappingType_.int64tostringmap_;
      }
      break;
    }
    case MAPPINGTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = MAPPINGTYPE_NOT_SET;
}